

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

bool SplitHostPort(string_view in,uint16_t *portOut,string *hostOut)

{
  bool bVar1;
  size_type __n;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  long in_FS_OFFSET;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> str;
  uint16_t n;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = in;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&local_40,':',0xffffffffffffffff);
  bVar1 = true;
  if (__n != 0xffffffffffffffff) {
    if (*local_40._M_str == '[') {
      bVar3 = local_40._M_str[__n - 1] == ']';
    }
    else {
      bVar3 = false;
    }
    if (__n - 1 < 0xfffffffffffffffe) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind(&local_40,':',__n - 1);
      if ((bool)(~bVar3 & sVar2 != 0xffffffffffffffff)) goto LAB_00af25d0;
    }
    str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_40,__n + 1,0xffffffffffffffff);
    bVar1 = ParseUInt16(str,&n);
    if (bVar1) {
      local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,__n);
      *portOut = n;
      bVar1 = n != 0;
    }
    else {
      bVar1 = false;
    }
  }
LAB_00af25d0:
  if (((local_40._M_len == 0) || (*local_40._M_str != '[')) ||
     (local_40._M_str[local_40._M_len - 1] != ']')) {
    __svt = &local_40;
  }
  else {
    _n = std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (&local_40,1,local_40._M_len - 2);
    __svt = (basic_string_view<char,_std::char_traits<char>_> *)&n;
  }
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)hostOut,__svt);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SplitHostPort(std::string_view in, uint16_t& portOut, std::string& hostOut)
{
    bool valid = false;
    size_t colon = in.find_last_of(':');
    // if a : is found, and it either follows a [...], or no other : is in the string, treat it as port separator
    bool fHaveColon = colon != in.npos;
    bool fBracketed = fHaveColon && (in[0] == '[' && in[colon - 1] == ']'); // if there is a colon, and in[0]=='[', colon is not 0, so in[colon-1] is safe
    bool fMultiColon{fHaveColon && colon != 0 && (in.find_last_of(':', colon - 1) != in.npos)};
    if (fHaveColon && (colon == 0 || fBracketed || !fMultiColon)) {
        uint16_t n;
        if (ParseUInt16(in.substr(colon + 1), &n)) {
            in = in.substr(0, colon);
            portOut = n;
            valid = (portOut != 0);
        }
    } else {
        valid = true;
    }
    if (in.size() > 0 && in[0] == '[' && in[in.size() - 1] == ']') {
        hostOut = in.substr(1, in.size() - 2);
    } else {
        hostOut = in;
    }

    return valid;
}